

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cc
# Opt level: O2

void __thiscall
sentencepiece::filesystem::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string_view filename,bool is_binary)

{
  ostream *this_00;
  uint *puVar1;
  int errnum;
  undefined1 local_1d0 [40];
  undefined4 local_1a8;
  ostringstream local_1a0 [376];
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_003b7548;
  util::Status::Status(&this->status_);
  if (filename._M_len == 0) {
    this_00 = (ostream *)&std::cout;
  }
  else {
    this_00 = (ostream *)operator_new(0x200);
    std::ofstream::ofstream(this_00,filename._M_str,(uint)is_binary * 4 + _S_out);
  }
  this->os_ = this_00;
  if (((byte)this_00[*(long *)(*(long *)this_00 + -0x18) + 0x20] & 5) != 0) {
    local_1a8 = 7;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"\"");
    std::operator<<((ostream *)local_1a0,filename._M_str);
    std::operator<<((ostream *)local_1a0,"\": ");
    puVar1 = (uint *)__errno_location();
    util::StrError_abi_cxx11_((string *)(local_1d0 + 8),(util *)(ulong)*puVar1,errnum);
    std::operator<<((ostream *)local_1a0,(string *)(local_1d0 + 8));
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)local_1d0);
    util::Status::operator=(&this->status_,(Status *)local_1d0);
    util::Status::~Status((Status *)local_1d0);
    std::__cxx11::string::~string((string *)(local_1d0 + 8));
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return;
}

Assistant:

PosixWritableFile(absl::string_view filename, bool is_binary = false)
      : os_(filename.empty()
                ? &std::cout
                : new std::ofstream(WPATH(filename),
                                    is_binary ? std::ios::binary | std::ios::out
                                              : std::ios::out)) {
    if (!*os_)
      status_ =
          util::StatusBuilder(util::StatusCode::kPermissionDenied, GTL_LOC)
          << "\"" << filename.data() << "\": " << util::StrError(errno);
  }